

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_data_reader.cpp
# Opt level: O1

void __thiscall
duckdb::TableDataReader::TableDataReader
          (TableDataReader *this,MetadataReader *reader,BoundCreateTableInfo *info)

{
  long lVar1;
  size_type sVar2;
  pointer pCVar3;
  PersistentTableData *this_00;
  
  this->reader = reader;
  this->info = info;
  pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&info->base);
  lVar1 = *(long *)((long)&pCVar3[1].catalog.field_2 + 8);
  sVar2 = pCVar3[1].catalog.field_2._M_allocated_capacity;
  this_00 = (PersistentTableData *)operator_new(0x50);
  PersistentTableData::PersistentTableData
            (this_00,((long)(lVar1 - sVar2) >> 3) * -0x7b425ed097b425ed);
  ::std::
  __uniq_ptr_impl<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>_>::
  reset((__uniq_ptr_impl<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>_>
         *)&info->data,this_00);
  return;
}

Assistant:

TableDataReader::TableDataReader(MetadataReader &reader, BoundCreateTableInfo &info) : reader(reader), info(info) {
	info.data = make_uniq<PersistentTableData>(info.Base().columns.LogicalColumnCount());
}